

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filename.cc
# Opt level: O3

string * leveldb::OldInfoLogFileName(string *__return_storage_ptr__,string *dbname)

{
  pointer pcVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__str;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (dbname->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + dbname->_M_string_length);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string OldInfoLogFileName(const std::string& dbname) {
  return dbname + "/LOG.old";
}